

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O0

void FixVerts(Level *NewLev,int radius)

{
  int iVar1;
  int in_ESI;
  long in_RDI;
  double Direction;
  Vertex *v;
  double local_20;
  double *local_18;
  
  for (local_18 = *(double **)(in_RDI + 0xe8); local_18 != (double *)0x0;
      local_18 = (double *)local_18[6]) {
    if (local_18[5] == 0.0) {
      if (local_18[4] != 0.0) {
        local_20 = -1.0;
        if (*(double **)((long)local_18[4] + 0x48) == local_18) {
          local_20 = 1.0;
        }
        local_18[2] = (double)in_ESI * local_20 * *(double *)((long)local_18[4] + 0x38) +
                      *(double *)((long)local_18[4] + 0x30) * (double)in_ESI + *local_18;
        local_18[3] = -((double)in_ESI * local_20) * *(double *)((long)local_18[4] + 0x30) +
                      *(double *)((long)local_18[4] + 0x38) * (double)in_ESI + local_18[1];
      }
    }
    else {
      iVar1 = CalcIntersection((Edge *)local_18[4],(Edge *)local_18[5],local_18 + 2,in_ESI);
      if (iVar1 == 0) {
        local_18[2] = *(double *)((long)local_18[4] + 0x30) * (double)in_ESI + *local_18;
        local_18[3] = *(double *)((long)local_18[4] + 0x38) * (double)in_ESI + local_18[1];
      }
    }
  }
  return;
}

Assistant:

static void FixVerts(struct Level *NewLev, int radius)
{
   struct Vertex *v = NewLev->AllVerts;

   while (v) {
      if (v->Edges[1]) {
         /* position normal at intersection of two connected edges */
         if (!CalcIntersection(v->Edges[0], v->Edges[1], v->Normal, radius)) {
            v->Normal[0] = v->Pos[0] + v->Edges[0]->a * radius;
            v->Normal[1] = v->Pos[1] + v->Edges[0]->b * radius;
         }
      } else if (v->Edges[0]) {
         /* position normal as a straight projection from v->Edges[0] */
         double Direction = -1.0f;

         if (v->Edges[0]->EndPoints[0] == v)
            Direction = 1.0f;

         v->Normal[0] =
            v->Pos[0] + v->Edges[0]->a * radius +
            radius * Direction * v->Edges[0]->b;
         v->Normal[1] =
            v->Pos[1] + v->Edges[0]->b * radius -
            radius * Direction * v->Edges[0]->a;
      }

      v = v->Next;
   }
}